

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_reader.hpp
# Opt level: O1

hugeint_t duckdb::DecimalParquetValueConversion<duckdb::hugeint_t,_false>::PlainRead<false>
                    (ByteBuffer *plain_data,ColumnReader *reader)

{
  ulong req_len;
  hugeint_t hVar1;
  
  ByteBuffer::available(plain_data,4);
  req_len = (ulong)*(uint *)plain_data->ptr;
  plain_data->len = plain_data->len - 4;
  plain_data->ptr = (data_ptr_t)((long)plain_data->ptr + 4);
  ByteBuffer::available(plain_data,req_len);
  hVar1 = ParquetDecimalUtils::ReadDecimalValue<duckdb::hugeint_t>
                    (plain_data->ptr,req_len,reader->column_schema);
  ByteBuffer::available(plain_data,req_len);
  plain_data->len = plain_data->len - req_len;
  plain_data->ptr = plain_data->ptr + req_len;
  return hVar1;
}

Assistant:

static DUCKDB_PHYSICAL_TYPE PlainRead(ByteBuffer &plain_data, ColumnReader &reader) {
		idx_t byte_len;
		if (FIXED_LENGTH) {
			byte_len = reader.Schema().type_length;
		} else {
			byte_len = plain_data.read<uint32_t>();
		}
		plain_data.available(byte_len);
		auto res = ParquetDecimalUtils::ReadDecimalValue<DUCKDB_PHYSICAL_TYPE>(const_data_ptr_cast(plain_data.ptr),
		                                                                       byte_len, reader.Schema());

		plain_data.inc(byte_len);
		return res;
	}